

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagfile_invalid_path_tests.cpp
# Opt level: O2

void __thiscall iu_Foo_x_iutest_x_Bar_Test::Body(iu_Foo_x_iutest_x_Bar_Test *this)

{
  int *in_R9;
  undefined1 local_1e8 [48];
  AssertionResult iutest_ar;
  Fixed local_190;
  
  local_1e8._0_4_ = 3;
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = local_1e8._0_4_;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"3","3",(char *)&local_190,(int *)local_1e8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/flagfile_invalid_path_tests.cpp"
               ,0x1c,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1e8,&local_190);
    std::__cxx11::string::~string((string *)local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(Foo, Bar)
{
    IUTEST_ASSERT_EQ(3, 3);
}